

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticencoder.cpp
# Opt level: O2

void __thiscall ArithmeticEncoder::propagate_carry(ArithmeticEncoder *this)

{
  U8 *pUVar1;
  U8 *pUVar2;
  
  pUVar2 = this->outbyte;
  if (pUVar2 == this->outbuffer) {
    pUVar2 = this->endbuffer;
  }
  pUVar2 = pUVar2 + -1;
  do {
    if (*pUVar2 != 0xff) {
      *pUVar2 = *pUVar2 + '\x01';
      return;
    }
    *pUVar2 = '\0';
    pUVar1 = this->endbuffer;
    if (pUVar2 == this->outbuffer) {
      pUVar2 = pUVar1;
    }
    pUVar2 = pUVar2 + -1;
    if (pUVar2 < this->outbuffer) {
      __assert_fail("outbuffer <= p",
                    "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                    ,0x14d,"void ArithmeticEncoder::propagate_carry()");
    }
    if (pUVar1 <= pUVar2) {
      __assert_fail("p < endbuffer",
                    "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                    ,0x14e,"void ArithmeticEncoder::propagate_carry()");
    }
  } while (this->outbyte < pUVar1);
  __assert_fail("outbyte < endbuffer",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                ,0x14f,"void ArithmeticEncoder::propagate_carry()");
}

Assistant:

inline void ArithmeticEncoder::propagate_carry()
{
  U8 * p;
  if (outbyte == outbuffer)
    p = endbuffer - 1;
  else
    p = outbyte - 1;
  while (*p == 0xFFU)
  {
    *p = 0;
    if (p == outbuffer)
      p = endbuffer - 1;
    else
      p--;
    assert(outbuffer <= p);
    assert(p < endbuffer);
    assert(outbyte < endbuffer);
  }
  ++*p;
}